

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O0

string * __thiscall antlr::Parser::getFilename_abi_cxx11_(Parser *this)

{
  ParserInputState *pPVar1;
  long in_RSI;
  string *in_RDI;
  
  pPVar1 = RefCount<antlr::ParserInputState>::operator->
                     ((RefCount<antlr::ParserInputState> *)(in_RSI + 8));
  std::__cxx11::string::string((string *)in_RDI,(string *)&pPVar1->filename);
  return in_RDI;
}

Assistant:

string getFilename() const
	{
		return inputState->filename;
	}